

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

double * __thiscall
TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::Insert
          (TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *this,FName *key,
          double *value)

{
  Node *pNVar1;
  FName local_20;
  FName local_1c;
  
  local_1c = (FName)key->Index;
  pNVar1 = FindKey(this,&local_1c);
  if (pNVar1 == (Node *)0x0) {
    local_20 = (FName)key->Index;
    pNVar1 = NewKey(this,&local_20);
  }
  (pNVar1->Pair).Value = *value;
  return &(pNVar1->Pair).Value;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}